

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O0

void __thiscall
SynthWidget::SynthWidget
          (SynthWidget *this,Master *master,SynthRoute *useSynthRoute,bool pinnable,
          AudioDevice *useAudioDevice,QWidget *parent)

{
  QFrame *pQVar1;
  QIcon *pQVar2;
  QCheckBox *pQVar3;
  byte bVar4;
  SynthRouteState SynthRouteState;
  SynthWidget *pSVar5;
  SynthStateMonitor *this_00;
  QSettings *pQVar6;
  int __fd;
  QObject local_d8 [8];
  QObject local_d0 [8];
  QObject local_c8 [8];
  QObject local_c0 [8];
  QObject local_b8 [8];
  QObject local_b0 [8];
  QVariant local_a8;
  QString local_88;
  QVariant local_70;
  byte local_4d;
  bool detailsVisible;
  QFlags<Qt::WindowType> local_3c;
  QWidget *local_38;
  QWidget *parent_local;
  AudioDevice *useAudioDevice_local;
  SynthRoute *pSStack_20;
  bool pinnable_local;
  SynthRoute *useSynthRoute_local;
  Master *master_local;
  SynthWidget *this_local;
  
  local_38 = parent;
  parent_local = (QWidget *)useAudioDevice;
  useAudioDevice_local._7_1_ = pinnable;
  pSStack_20 = useSynthRoute;
  useSynthRoute_local = (SynthRoute *)master;
  master_local = (Master *)this;
  QFlags<Qt::WindowType>::QFlags(&local_3c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_3c.i);
  *(undefined ***)this = &PTR_metaObject_00210528;
  *(undefined ***)&this->field_0x10 = &PTR__SynthWidget_002106d8;
  this->synthRoute = pSStack_20;
  pSVar5 = (SynthWidget *)operator_new(400);
  this->ui = pSVar5;
  SynthPropertiesDialog::SynthPropertiesDialog
            ((SynthPropertiesDialog *)&this->spd,local_38,pSStack_20);
  AudioPropertiesDialog::AudioPropertiesDialog((AudioPropertiesDialog *)&this->apd,local_38);
  MidiPropertiesDialog::MidiPropertiesDialog((MidiPropertiesDialog *)&this->mpd,local_38);
  Ui_SynthWidget::setupUi(&this->ui->super_Ui_SynthWidget,&this->super_QWidget);
  setEmuModeText(this);
  this_00 = (SynthStateMonitor *)operator_new(0x1c8);
  SynthStateMonitor::SynthStateMonitor(this_00,this->ui,this->synthRoute);
  this->synthStateMonitor = this_00;
  pQVar6 = Master::getSettings((Master *)useSynthRoute_local);
  QString::QString(&local_88,"Master/showSynthDetails");
  QVariant::QVariant(&local_a8,"0");
  QSettings::value((QString *)&local_70,(QVariant *)pQVar6);
  bVar4 = QVariant::toBool();
  QVariant::~QVariant(&local_70);
  QVariant::~QVariant(&local_a8);
  QString::~QString(&local_88);
  local_4d = bVar4 & 1;
  pQVar1 = (this->ui->super_Ui_SynthWidget).detailsFrame;
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,local_4d);
  pQVar2 = (QIcon *)(this->ui->super_Ui_SynthWidget).detailsButton;
  getSynthDetailsIcon((bool)(local_4d & 1));
  QAbstractButton::setIcon(pQVar2);
  refreshAudioDeviceList(this,(Master *)useSynthRoute_local,(AudioDevice *)parent_local);
  pQVar3 = (this->ui->super_Ui_SynthWidget).pinCheckBox;
  Master::isPinned((Master *)useSynthRoute_local,this->synthRoute);
  QAbstractButton::setChecked(SUB81(pQVar3,0));
  QWidget::setEnabled(SUB81((this->ui->super_Ui_SynthWidget).pinCheckBox,0));
  Master::configureMidiPropertiesDialog((Master *)useSynthRoute_local,&this->mpd);
  updateMidiAddActionEnabled(this->ui);
  __fd = (int)this;
  QObject::connect(local_b0,__fd,(sockaddr *)this->synthRoute,0x1cb467);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  QObject::connect(local_b8,__fd,(sockaddr *)this->synthRoute,0x1cb4ae);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  QObject::connect(local_c0,__fd,(sockaddr *)this->synthRoute,0x1cb4f6);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  QObject::connect(local_c8,__fd,(sockaddr *)this->synthRoute,0x1cb542);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  QObject::connect(local_d0,__fd,(sockaddr *)useSynthRoute_local,0x1c6f7b);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  QObject::connect(local_d8,(char *)(this->ui->super_Ui_SynthWidget).synthPropertiesButton,
                   (QObject *)"2clicked()",(char *)&this->spd,0x1cb5b0);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  SynthRoute::connectReportHandler
            (this->synthRoute,"2masterVolumeChanged(int)",(QObject *)this,
             "1handleMasterVolumeChanged(int)");
  SynthRouteState = SynthRoute::getState(this->synthRoute);
  handleSynthRouteState(this,SynthRouteState);
  return;
}

Assistant:

SynthWidget::SynthWidget(Master *master, SynthRoute *useSynthRoute, bool pinnable, const AudioDevice *useAudioDevice, QWidget *parent) :
	QWidget(parent),
	synthRoute(useSynthRoute),
	ui(new Ui::SynthWidget),
	spd(parent, useSynthRoute),
	apd(parent),
	mpd(parent)
{
	ui->setupUi(this);

	setEmuModeText();

	synthStateMonitor = new SynthStateMonitor(ui, synthRoute);

	bool detailsVisible = master->getSettings()->value("Master/showSynthDetails", "0").toBool();
	ui->detailsFrame->setVisible(detailsVisible);
	ui->detailsButton->setIcon(SynthWidget::getSynthDetailsIcon(detailsVisible));

	refreshAudioDeviceList(master, useAudioDevice);
	ui->pinCheckBox->setChecked(master->isPinned(synthRoute));
	ui->pinCheckBox->setEnabled(pinnable);

	master->configureMidiPropertiesDialog(mpd);
	updateMidiAddActionEnabled(ui);

	connect(synthRoute, SIGNAL(stateChanged(SynthRouteState)), SLOT(handleSynthRouteState(SynthRouteState)));
	connect(synthRoute, SIGNAL(midiSessionAdded(MidiSession *)), SLOT(handleMIDISessionAdded(MidiSession *)));
	connect(synthRoute, SIGNAL(midiSessionRemoved(MidiSession *)), SLOT(handleMIDISessionRemoved(MidiSession *)));
	connect(synthRoute, SIGNAL(midiSessionNameChanged(MidiSession *)), SLOT(handleMIDISessionNameChanged(MidiSession *)));
	connect(master, SIGNAL(synthRoutePinned()), SLOT(handleSynthRoutePinned()));
	connect(ui->synthPropertiesButton, SIGNAL(clicked()), &spd, SLOT(exec()));

	synthRoute->connectReportHandler(SIGNAL(masterVolumeChanged(int)), this, SLOT(handleMasterVolumeChanged(int)));

	handleSynthRouteState(synthRoute->getState());
}